

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_filesystem.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  CSV_writer *pCVar3;
  uint uVar4;
  undefined1 local_2e0 [32];
  bool bStack_2c0;
  undefined1 local_2b8 [48];
  string out_dir;
  string out_file;
  string nested;
  resolver local_218;
  path path1;
  path path2;
  CSV_writer csv;
  
  filesystem::path::path(&path1,"/dir 1/dir 2/");
  filesystem::path::path(&path2,"dir 3");
  filesystem::path::exists(&path1);
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = filesystem::operator<<((ostream *)&std::cout,&path1);
  std::endl<char,std::char_traits<char>>(poVar2);
  filesystem::path::operator/((path *)&csv,&path1,&path2);
  poVar2 = filesystem::operator<<((ostream *)&std::cout,(path *)&csv);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&csv.m_delim._M_string_length);
  filesystem::path::operator/((path *)local_2e0,&path1,&path2);
  filesystem::path::parent_path((path *)&csv,(path *)local_2e0);
  poVar2 = filesystem::operator<<((ostream *)&std::cout,(path *)&csv);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&csv.m_delim._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2e0 + 8));
  filesystem::path::operator/((path *)local_2b8,&path1,&path2);
  filesystem::path::parent_path((path *)local_2e0,(path *)local_2b8);
  filesystem::path::parent_path((path *)&csv,(path *)local_2e0);
  poVar2 = filesystem::operator<<((ostream *)&std::cout,(path *)&csv);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&csv.m_delim._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2e0 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2b8 + 8));
  filesystem::path::operator/((path *)&out_dir,&path1,&path2);
  filesystem::path::parent_path((path *)local_2b8,(path *)&out_dir);
  filesystem::path::parent_path((path *)local_2e0,(path *)local_2b8);
  filesystem::path::parent_path((path *)&csv,(path *)local_2e0);
  poVar2 = filesystem::operator<<((ostream *)&std::cout,(path *)&csv);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&csv.m_delim._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2e0 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2b8 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&out_dir._M_string_length);
  filesystem::path::operator/((path *)&out_file,&path1,&path2);
  filesystem::path::parent_path((path *)&out_dir,(path *)&out_file);
  filesystem::path::parent_path((path *)local_2b8,(path *)&out_dir);
  filesystem::path::parent_path((path *)local_2e0,(path *)local_2b8);
  filesystem::path::parent_path((path *)&csv,(path *)local_2e0);
  poVar2 = filesystem::operator<<((ostream *)&std::cout,(path *)&csv);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&csv.m_delim._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2e0 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2b8 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&out_dir._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&out_file._M_string_length);
  local_2e0._0_4_ = native_path;
  local_2e0._8_8_ = (pointer)0x0;
  local_2e0[0x10] = '\0';
  local_2e0._17_7_ = 0;
  local_2e0[0x18] = '\0';
  local_2e0._25_7_ = 0;
  bStack_2c0 = false;
  filesystem::path::parent_path((path *)&csv,(path *)local_2e0);
  poVar2 = filesystem::operator<<((ostream *)&std::cout,(path *)&csv);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&csv.m_delim._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2e0 + 8));
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<((ostream *)&std::cout,"Current directory = ");
  filesystem::path::path((path *)local_2e0,".");
  filesystem::path::make_absolute((path *)&csv,(path *)local_2e0);
  poVar2 = filesystem::operator<<(poVar2,(path *)&csv);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&csv.m_delim._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2e0 + 8));
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          chrono::GetChronoOutputPath_abi_cxx11_();
  std::operator+(&out_dir,__lhs,"DEMO_FILESYSTEM");
  std::operator+(&out_file,&out_dir,"/foo.txt");
  poVar2 = std::operator<<((ostream *)&std::cout,"Create output directory;  out_dir = ");
  poVar2 = std::operator<<(poVar2,(string *)&out_dir);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"  out_dir exists? ");
  filesystem::path::path((path *)&csv,&out_dir);
  filesystem::path::exists((path *)&csv);
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::endl<char,std::char_traits<char>>(poVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&csv.m_delim._M_string_length);
  filesystem::path::path((path *)&csv,&out_dir);
  bVar1 = filesystem::create_directory((path *)&csv);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&csv.m_delim._M_string_length);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"  ...Created output directory");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"  out_dir exists? ");
    filesystem::path::path((path *)&csv,&out_dir);
    filesystem::path::exists((path *)&csv);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::endl<char,std::char_traits<char>>(poVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&csv.m_delim._M_string_length);
    poVar2 = std::operator<<((ostream *)&std::cout,"  out_dir is directory? ");
    filesystem::path::path((path *)&csv,&out_dir);
    filesystem::path::is_directory((path *)&csv);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::endl<char,std::char_traits<char>>(poVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&csv.m_delim._M_string_length);
    poVar2 = std::operator<<((ostream *)&std::cout,"  path of out_dir: ");
    filesystem::path::path((path *)&csv,&out_dir);
    poVar2 = filesystem::operator<<(poVar2,(path *)&csv);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&csv.m_delim._M_string_length);
    poVar2 = std::operator<<((ostream *)&std::cout,"  abs. path of out_dir: ");
    filesystem::path::path((path *)local_2e0,&out_dir);
    filesystem::path::make_absolute((path *)&csv,(path *)local_2e0);
    poVar2 = filesystem::operator<<(poVar2,(path *)&csv);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&csv.m_delim._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2e0 + 8));
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar2 = std::operator<<((ostream *)&std::cout,"Create output file;  out_file = ");
    poVar2 = std::operator<<(poVar2,(string *)&out_file);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"  out_file exists? ");
    filesystem::path::path((path *)&csv,&out_file);
    filesystem::path::exists((path *)&csv);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::endl<char,std::char_traits<char>>(poVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&csv.m_delim._M_string_length);
    std::__cxx11::string::string((string *)local_2e0,",",(allocator *)local_2b8);
    chrono::utils::CSV_writer::CSV_writer(&csv,(string *)local_2e0);
    std::__cxx11::string::~string((string *)local_2e0);
    local_2b8._0_8_ = (pointer)0x3ff0000000000000;
    local_2b8._8_8_ = (pointer)0x4000000000000000;
    local_2b8._16_8_ = (pointer)0x4008000000000000;
    pCVar3 = chrono::utils::operator<<(&csv,(ChVector<double> *)local_2b8);
    local_2e0._0_8_ = (pointer)0x3ff0000000000000;
    local_2e0[0x18] = '\0';
    local_2e0._25_7_ = 0;
    local_2e0._8_8_ = (pointer)0x0;
    local_2e0[0x10] = '\0';
    local_2e0._17_7_ = 0;
    pCVar3 = chrono::utils::operator<<(pCVar3,(ChQuaternion<double> *)local_2e0);
    std::endl<char,std::char_traits<char>>((ostream *)&pCVar3->m_ss);
    std::__cxx11::string::string((string *)local_2e0,"",(allocator *)local_2b8);
    chrono::utils::CSV_writer::write_to_file(&csv,&out_file,(string *)local_2e0);
    std::__cxx11::string::~string((string *)local_2e0);
    poVar2 = std::operator<<((ostream *)&std::cout,"  ...Created output file");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"  out_file exists? ");
    filesystem::path::path((path *)local_2e0,&out_file);
    filesystem::path::exists((path *)local_2e0);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::endl<char,std::char_traits<char>>(poVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2e0 + 8));
    poVar2 = std::operator<<((ostream *)&std::cout,"  out_file is file? ");
    filesystem::path::path((path *)local_2e0,&out_file);
    filesystem::path::is_file((path *)local_2e0);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::endl<char,std::char_traits<char>>(poVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2e0 + 8));
    poVar2 = std::operator<<((ostream *)&std::cout,"  path of out_file: ");
    filesystem::path::path((path *)local_2e0,&out_file);
    poVar2 = filesystem::operator<<(poVar2,(path *)local_2e0);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2e0 + 8));
    poVar2 = std::operator<<((ostream *)&std::cout,"  file location:    ");
    filesystem::path::path((path *)local_2b8,&out_file);
    filesystem::path::parent_path((path *)local_2e0,(path *)local_2b8);
    poVar2 = filesystem::operator<<(poVar2,(path *)local_2e0);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2e0 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2b8 + 8));
    poVar2 = std::operator<<((ostream *)&std::cout,"  abs. path of out_file: ");
    filesystem::path::path((path *)local_2b8,&out_file);
    filesystem::path::make_absolute((path *)local_2e0,(path *)local_2b8);
    poVar2 = filesystem::operator<<(poVar2,(path *)local_2e0);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2e0 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2b8 + 8));
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator+(&nested,&out_dir,"/child/grandchild");
    poVar2 = std::operator<<((ostream *)&std::cout,"Create nested directories;  nested = ");
    poVar2 = std::operator<<(poVar2,(string *)&nested);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"  nested (as path)   = ");
    filesystem::path::path((path *)local_2e0,&nested);
    poVar2 = filesystem::operator<<(poVar2,(path *)local_2e0);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2e0 + 8));
    poVar2 = std::operator<<((ostream *)&std::cout,"  length of nested   = ");
    filesystem::path::path((path *)local_2e0,&nested);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2e0 + 8));
    poVar2 = std::operator<<((ostream *)&std::cout,"  nested exists? ");
    filesystem::path::path((path *)local_2e0,&nested);
    filesystem::path::exists((path *)local_2e0);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::endl<char,std::char_traits<char>>(poVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2e0 + 8));
    filesystem::path::path((path *)local_2e0,&nested);
    bVar1 = filesystem::create_subdirectory((path *)local_2e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2e0 + 8));
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"  ...Error creating subdirectories");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"  ...Created nested subdirectories");
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&std::cout,"  nested exists? ");
      filesystem::path::path((path *)local_2e0,&nested);
      filesystem::path::exists((path *)local_2e0);
      poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"  nested is directory? ");
      filesystem::path::path((path *)local_2e0,&nested);
      filesystem::path::is_directory((path *)local_2e0);
      poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"  path of nested: ");
      filesystem::path::path((path *)local_2e0,&nested);
      poVar2 = filesystem::operator<<(poVar2,(path *)local_2e0);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"  abs. path of nested: ");
      filesystem::path::path((path *)local_2b8,&nested);
      filesystem::path::make_absolute((path *)local_2e0,(path *)local_2b8);
      poVar2 = filesystem::operator<<(poVar2,(path *)local_2e0);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2b8 + 8));
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar2 = std::operator<<((ostream *)&std::cout,"some/path.ext:operator==() = ");
      filesystem::path::path((path *)local_2e0,"some/path.ext");
      filesystem::path::path((path *)local_2b8,"some/path.ext");
      std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_2b8 + 8),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_2e0 + 8));
      poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2b8 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"some/path.ext:operator==() (unequal) = ");
      filesystem::path::path((path *)local_2e0,"some/path.ext");
      filesystem::path::path((path *)local_2b8,"another/path.ext");
      std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_2b8 + 8),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_2e0 + 8));
      poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2b8 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"nonexistant:exists = ");
      filesystem::path::path((path *)local_2e0,"nonexistant");
      filesystem::path::exists((path *)local_2e0);
      poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"nonexistant:is_file = ");
      filesystem::path::path((path *)local_2e0,"nonexistant");
      filesystem::path::is_file((path *)local_2e0);
      poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"nonexistant:is_directory = ");
      filesystem::path::path((path *)local_2e0,"nonexistant");
      filesystem::path::is_directory((path *)local_2e0);
      poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"nonexistant:filename = ");
      filesystem::path::path((path *)local_2e0,"nonexistant");
      filesystem::path::filename_abi_cxx11_((string *)local_2b8,(path *)local_2e0);
      poVar2 = std::operator<<(poVar2,(string *)local_2b8);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)local_2b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"nonexistant:extension = ");
      filesystem::path::path((path *)local_2e0,"nonexistant");
      filesystem::path::extension_abi_cxx11_((string *)local_2b8,(path *)local_2e0);
      poVar2 = std::operator<<(poVar2,(string *)local_2b8);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)local_2b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar2 = std::operator<<((ostream *)&std::cout,"out_file:exists = ");
      filesystem::path::path((path *)local_2e0,&out_file);
      filesystem::path::exists((path *)local_2e0);
      poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"out_file:is_file = ");
      filesystem::path::path((path *)local_2e0,&out_file);
      filesystem::path::is_file((path *)local_2e0);
      poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"out_file:is_directory = ");
      filesystem::path::path((path *)local_2e0,&out_file);
      filesystem::path::is_directory((path *)local_2e0);
      poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"out_file:filename = ");
      filesystem::path::path((path *)local_2e0,&out_file);
      filesystem::path::filename_abi_cxx11_((string *)local_2b8,(path *)local_2e0);
      poVar2 = std::operator<<(poVar2,(string *)local_2b8);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)local_2b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"out_file:stem = ");
      filesystem::path::path((path *)local_2e0,&out_file);
      filesystem::path::stem_abi_cxx11_((string *)local_2b8,(path *)local_2e0);
      poVar2 = std::operator<<(poVar2,(string *)local_2b8);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)local_2b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"out_file:extension = ");
      filesystem::path::path((path *)local_2e0,&out_file);
      filesystem::path::extension_abi_cxx11_((string *)local_2b8,(path *)local_2e0);
      poVar2 = std::operator<<(poVar2,(string *)local_2b8);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)local_2b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"out_file:make_absolute = ");
      filesystem::path::path((path *)local_2b8,&out_file);
      filesystem::path::make_absolute((path *)local_2e0,(path *)local_2b8);
      poVar2 = filesystem::operator<<(poVar2,(path *)local_2e0);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2b8 + 8));
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar2 = std::operator<<((ostream *)&std::cout,"out_dir:exists = ");
      filesystem::path::path((path *)local_2e0,&out_dir);
      filesystem::path::exists((path *)local_2e0);
      poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"out_dir:is_file = ");
      filesystem::path::path((path *)local_2e0,&out_dir);
      filesystem::path::is_file((path *)local_2e0);
      poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"out_dir:is_directory = ");
      filesystem::path::path((path *)local_2e0,&out_dir);
      filesystem::path::is_directory((path *)local_2e0);
      poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"out_dir:filename = ");
      filesystem::path::path((path *)local_2e0,&out_dir);
      filesystem::path::filename_abi_cxx11_((string *)local_2b8,(path *)local_2e0);
      poVar2 = std::operator<<(poVar2,(string *)local_2b8);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)local_2b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"out_dir:stem = ");
      filesystem::path::path((path *)local_2e0,&out_dir);
      filesystem::path::stem_abi_cxx11_((string *)local_2b8,(path *)local_2e0);
      poVar2 = std::operator<<(poVar2,(string *)local_2b8);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)local_2b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"out_dir:extension = ");
      filesystem::path::path((path *)local_2e0,&out_dir);
      filesystem::path::extension_abi_cxx11_((string *)local_2b8,(path *)local_2e0);
      poVar2 = std::operator<<(poVar2,(string *)local_2b8);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)local_2b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      poVar2 = std::operator<<((ostream *)&std::cout,"out_dir:make_absolute = ");
      filesystem::path::path((path *)local_2b8,&out_dir);
      filesystem::path::make_absolute((path *)local_2e0,(path *)local_2b8);
      poVar2 = filesystem::operator<<(poVar2,(path *)local_2e0);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2b8 + 8));
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar2 = std::operator<<((ostream *)&std::cout,"resolve(out_file) = ");
      filesystem::resolver::resolver(&local_218);
      filesystem::path::path((path *)local_2b8,&out_file);
      filesystem::resolver::resolve((path *)local_2e0,&local_218,(path *)local_2b8);
      poVar2 = filesystem::operator<<(poVar2,(path *)local_2e0);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2b8 + 8));
      std::vector<filesystem::path,_std::allocator<filesystem::path>_>::~vector(&local_218.m_paths);
      poVar2 = std::operator<<((ostream *)&std::cout,"resolve(nonexistant) = ");
      filesystem::resolver::resolver(&local_218);
      filesystem::path::path((path *)local_2b8,"nonexistant");
      filesystem::resolver::resolve((path *)local_2e0,&local_218,(path *)local_2b8);
      poVar2 = filesystem::operator<<(poVar2,(path *)local_2e0);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2b8 + 8));
      std::vector<filesystem::path,_std::allocator<filesystem::path>_>::~vector(&local_218.m_paths);
    }
    uVar4 = (uint)!bVar1;
    std::__cxx11::string::~string((string *)&nested);
    chrono::utils::CSV_writer::~CSV_writer(&csv);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"  ...Error creating output directory");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar4 = 1;
  }
  std::__cxx11::string::~string((string *)&out_file);
  std::__cxx11::string::~string((string *)&out_dir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&path2.m_path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&path1.m_path);
  return uVar4;
}

Assistant:

int main(int argc, char** argv) {
#if defined(WIN32)
    path path1("C:\\dir 1\\dir 2\\");
#else
    path path1("/dir 1/dir 2/");
#endif

    path path2("dir 3");

    cout << path1.exists() << endl;
    cout << path1 << endl;
    cout << (path1 / path2) << endl;
    cout << (path1 / path2).parent_path() << endl;
    cout << (path1 / path2).parent_path().parent_path() << endl;
    cout << (path1 / path2).parent_path().parent_path().parent_path() << endl;
    cout << (path1 / path2).parent_path().parent_path().parent_path().parent_path() << endl;
    cout << path().parent_path() << endl;
    cout << endl;

    // Absolute path of current directory
    cout << "Current directory = " << path(".").make_absolute() << endl;
    cout << endl;

    // Create output directory and output file
    std::string out_dir = GetChronoOutputPath() + "DEMO_FILESYSTEM";
    std::string out_file = out_dir + "/foo.txt";

    cout << "Create output directory;  out_dir = " << out_dir << endl;
    cout << "  out_dir exists? " << path(out_dir).exists() << endl;
    if (create_directory(path(out_dir))) {
        cout << "  ...Created output directory" << endl;
    } else {
        cout << "  ...Error creating output directory" << endl;
        return 1;
    }
    cout << "  out_dir exists? " << path(out_dir).exists() << endl;
    cout << "  out_dir is directory? " << path(out_dir).is_directory() << endl;
    cout << "  path of out_dir: " << path(out_dir) << endl;
    cout << "  abs. path of out_dir: " << path(out_dir).make_absolute() << endl;
    cout << endl;

    cout << "Create output file;  out_file = " << out_file << endl;
    cout << "  out_file exists? " << path(out_file).exists() << endl;
    utils::CSV_writer csv(",");
    csv << ChVector<>(1, 2, 3) << ChQuaternion<>(1, 0, 0, 0) << endl;
    csv.write_to_file(out_file);
    cout << "  ...Created output file" << endl;
    cout << "  out_file exists? " << path(out_file).exists() << endl;
    cout << "  out_file is file? " << path(out_file).is_file() << endl;
    cout << "  path of out_file: " << path(out_file) << endl;
    cout << "  file location:    " << path(out_file).parent_path() << endl;
    cout << "  abs. path of out_file: " << path(out_file).make_absolute() << endl;
    cout << endl;

    // Create hierarchy of nested directories
#if defined(WIN32)
    std::string nested = out_dir + "\\child\\grandchild";
#else
    std::string nested = out_dir + "/child/grandchild";
#endif
    cout << "Create nested directories;  nested = " << nested << endl;
    cout << "  nested (as path)   = " << path(nested) << endl;
    cout << "  length of nested   = " << path(nested).length() << endl;
    cout << "  nested exists? " << path(nested).exists() << endl;
    if (create_subdirectory(path(nested))) {
        cout << "  ...Created nested subdirectories" << endl;
    } else {
        cout << "  ...Error creating subdirectories" << endl;
        return 1;
    }
    cout << "  nested exists? " << path(nested).exists() << endl;
    cout << "  nested is directory? " << path(nested).is_directory() << endl;
    cout << "  path of nested: " << path(nested) << endl;
    cout << "  abs. path of nested: " << path(nested).make_absolute() << endl;
    cout << endl;

    // Other tests

    cout << "some/path.ext:operator==() = " << (path("some/path.ext") == path("some/path.ext")) << endl;
    cout << "some/path.ext:operator==() (unequal) = " << (path("some/path.ext") == path("another/path.ext")) << endl;

    cout << "nonexistant:exists = " << path("nonexistant").exists() << endl;
    cout << "nonexistant:is_file = " << path("nonexistant").is_file() << endl;
    cout << "nonexistant:is_directory = " << path("nonexistant").is_directory() << endl;
    cout << "nonexistant:filename = " << path("nonexistant").filename() << endl;
    cout << "nonexistant:extension = " << path("nonexistant").extension() << endl;
    cout << endl;

    cout << "out_file:exists = " << path(out_file).exists() << endl;
    cout << "out_file:is_file = " << path(out_file).is_file() << endl;
    cout << "out_file:is_directory = " << path(out_file).is_directory() << endl;
    cout << "out_file:filename = " << path(out_file).filename() << endl;
    cout << "out_file:stem = " << path(out_file).stem() << endl;
    cout << "out_file:extension = " << path(out_file).extension() << endl;
    cout << "out_file:make_absolute = " << path(out_file).make_absolute() << endl;
    cout << endl;

    cout << "out_dir:exists = " << path(out_dir).exists() << endl;
    cout << "out_dir:is_file = " << path(out_dir).is_file() << endl;
    cout << "out_dir:is_directory = " << path(out_dir).is_directory() << endl;
    cout << "out_dir:filename = " << path(out_dir).filename() << endl;
    cout << "out_dir:stem = " << path(out_dir).stem() << endl;
    cout << "out_dir:extension = " << path(out_dir).extension() << endl;
    cout << "out_dir:make_absolute = " << path(out_dir).make_absolute() << endl;
    cout << endl;

    cout << "resolve(out_file) = " << resolver().resolve(out_file) << endl;
    cout << "resolve(nonexistant) = " << resolver().resolve("nonexistant") << endl;
    return 0;
}